

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrdrivr.c
# Opt level: O1

FT_Error pfr_get_advance(FT_Face pfrface,FT_UInt gindex,FT_Pos *anadvance)

{
  FT_Error FVar1;
  
  *anadvance = 0;
  FVar1 = 6;
  if (((gindex != 0) && (pfrface != (FT_Face)0x0)) &&
     (gindex - 1 < *(uint *)&pfrface[2].generic.data)) {
    *anadvance = (long)*(int *)(pfrface[2].bbox.xMin + 4 + (ulong)(gindex - 1) * 0x10);
    FVar1 = 0;
  }
  return FVar1;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pfr_get_advance( FT_Face   pfrface,       /* PFR_Face */
                   FT_UInt   gindex,
                   FT_Pos   *anadvance )
  {
    PFR_Face  face  = (PFR_Face)pfrface;
    FT_Error  error = FT_ERR( Invalid_Argument );


    *anadvance = 0;

    if ( !gindex )
      goto Exit;

    gindex--;

    if ( face )
    {
      PFR_PhyFont  phys = &face->phy_font;


      if ( gindex < phys->num_chars )
      {
        *anadvance = phys->chars[gindex].advance;
        error      = FT_Err_Ok;
      }
    }

  Exit:
    return error;
  }